

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O1

uint32 * rw::ps2::instanceRGBA(uint32 *p,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  RGBA *pRVar1;
  uint16 *puVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = n + idx;
  if ((g->flags & 8) == 0) {
    if (idx < uVar4) {
      do {
        ((RGBA *)p)->red = '\0';
        ((RGBA *)p)->green = '\0';
        ((RGBA *)p)->blue = '\0';
        ((RGBA *)p)->alpha = 0xff;
        p = (uint32 *)((RGBA *)p + 1);
        n = n - 1;
      } while (n != 0);
    }
  }
  else if (idx < uVar4) {
    pRVar1 = g->colors;
    puVar2 = m->indices;
    uVar3 = (ulong)idx;
    do {
      *p = (uint32)pRVar1[puVar2[uVar3]];
      p = (uint32 *)((RGBA *)p + 1);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (((ulong)p & 0xf) != 0) {
    uVar3 = (ulong)(0xcU - (int)p & 0xc);
    memset(p,0,uVar3 + 4);
    p = (uint32 *)(&((RGBA *)p)[1].red + uVar3);
  }
  return (uint32 *)(RGBA *)p;
}

Assistant:

uint32*
instanceRGBA(uint32 *p, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	uint32 *d = (uint32*)g->colors;
	if((g->flags & Geometry::PRELIT))
		for(uint32 i = idx; i < idx+n; i++){
			j = m->indices[i];
			*p++ = d[j];
		}
	else
		for(uint32 i = idx; i < idx+n; i++)
			*p++ = 0xFF000000;
	while((uintptr)p % 0x10)
		*p++ = 0;
	return p;
}